

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

bool fmt::v5::internal::is_arithmetic(type t)

{
  bool local_5;
  type t_local;
  
  local_5 = 0 < (int)t && (int)t < 10;
  return local_5;
}

Assistant:

FMT_CONSTEXPR bool is_arithmetic(type t) {
  FMT_ASSERT(t != internal::named_arg_type, "invalid argument type");
  return t > internal::none_type && t <= internal::last_numeric_type;
}